

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_package.cpp
# Opt level: O0

bool __thiscall
ParsePackage::PackageFuncList
          (ParsePackage *this,char *buf,int *len,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *func_map)

{
  bool bVar1;
  char *end_00;
  size_type sVar2;
  size_t sVar3;
  char *local_68;
  char *local_60;
  _Self local_58;
  _Self local_50;
  iterator iter;
  char *pcStack_40;
  int num;
  char *cur;
  char *end;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *func_map_local;
  int *len_local;
  char *buf_local;
  ParsePackage *this_local;
  
  if (buf == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    end_00 = buf + *len;
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(func_map);
    iter._M_node._4_4_ = (undefined4)sVar2;
    iter._M_node._0_4_ = 4;
    bVar1 = _SafeSprintf<MessageType>(this,false,buf,end_00,"%d|",(MessageType *)&iter);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pcStack_40 = buf + 2;
      bVar1 = _SafeSprintf<int&>(this,false,pcStack_40,end_00,"%d|",(int *)((long)&iter._M_node + 4)
                                );
      if (bVar1) {
        sVar3 = strlen(pcStack_40);
        pcStack_40 = pcStack_40 + sVar3;
        local_50._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(func_map);
        while( true ) {
          local_58._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(func_map);
          bVar1 = std::operator!=(&local_50,&local_58);
          if (!bVar1) break;
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator->(&local_50);
          local_60 = (char *)std::__cxx11::string::c_str();
          bVar1 = _SafeSprintf<char_const*>(this,false,pcStack_40,end_00,"%s|",&local_60);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            return false;
          }
          sVar3 = strlen(pcStack_40);
          pcStack_40 = pcStack_40 + sVar3;
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator->(&local_50);
          local_68 = (char *)std::__cxx11::string::c_str();
          bVar1 = _SafeSprintf<char_const*>(this,false,pcStack_40,end_00,"%s|",&local_68);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            return false;
          }
          sVar3 = strlen(pcStack_40);
          pcStack_40 = pcStack_40 + sVar3;
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator++(&local_50);
        }
        bVar1 = _SafeSprintf<char_const(&)[5]>
                          (this,false,pcStack_40,end_00,"%s",(char (*) [5])"\r\n\r\n");
        if (bVar1) {
          sVar3 = strlen(pcStack_40);
          *len = ((int)sVar3 + (int)pcStack_40) - (int)buf;
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ParsePackage::PackageFuncList(char* buf, int& len, std::map<std::string, std::string>& func_map) {
    if (!buf) {
        return false;
    }

    char* end = buf + len;
    char* cur = buf;
    int num = (int)func_map.size();
    //type
    if (!_SafeSprintf(false, cur, end, "%d|", FUNCTION_INFO))
        return false;
    cur += 2;
    //function num
    if (!_SafeSprintf(false, cur, end, "%d|", num))
        return false;
    cur += strlen(cur);
    
    for (auto iter = func_map.begin(); iter != func_map.end(); ++iter) {
        if (!_SafeSprintf(false, cur, end, "%s|", iter->first.c_str()))
            return false;
        cur += strlen(cur);

        if (!_SafeSprintf(false, cur, end, "%s|", iter->second.c_str()))
            return false;
        cur += strlen(cur);
    }
    if (!_SafeSprintf(false, cur, end, "%s", "\r\n\r\n"))
        return false;
    cur += strlen(cur);
    len = cur - buf;
    return true;
}